

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_fxaashader.cpp
# Opt level: O2

void __thiscall FFXAAShader::Bind(FFXAAShader *this)

{
  FShaderProgram *this_00;
  GLint GVar1;
  
  this_00 = &this->mShader;
  if ((this->mShader).mProgram == 0) {
    FShaderProgram::Compile(this_00,Vertex,"shaders/glsl/screenquad.vp",(char *)"",0x14a);
    FShaderProgram::Compile(this_00,Fragment,"shaders/glsl/fxaa.fp",(char *)"",0x14a);
    FShaderProgram::SetFragDataLocation(this_00,0,"FragColor");
    FShaderProgram::Link(this_00,"shaders/glsl/fxaa");
    FShaderProgram::SetAttribLocation(this_00,0,"PositionInProjection");
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"InputTexture");
    (this->InputTexture).mIndex = GVar1;
    (this->InputTexture).mBuffer = 0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Resolution");
    (this->Resolution).mIndex = GVar1;
    (this->Resolution).mBuffer[0] = 0.0;
    (this->Resolution).mBuffer[1] = 0.0;
  }
  FShaderProgram::Bind(this_00);
  return;
}

Assistant:

void FFXAAShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/fxaa.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/fxaa");
		mShader.SetAttribLocation(0, "PositionInProjection");
		InputTexture.Init(mShader, "InputTexture");
		Resolution.Init(mShader, "Resolution");
	}

	mShader.Bind();
}